

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O2

void __thiscall
BronKerbosch::addAlignment
          (BronKerbosch *this,
          unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *alignment_autoptr,
          int *edgecounter,int *nonEdgeCounter,int numGCAllowedPos,int ct)

{
  alignment_id_t id;
  size_t sVar1;
  AlignmentRecord *this_00;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
  *this_01;
  EdgeCalculator *pEVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  adjacency_list_t *paVar6;
  size_type sVar7;
  mapped_type *this_02;
  iterator iVar8;
  _List_node_base *p_Var9;
  allocator_type local_79;
  uint local_78;
  uint local_74;
  adjacency_list_t *vertex;
  const_iterator local_68;
  AlignmentRecord *alignment;
  vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *local_58;
  size_type ind;
  _List_node_header local_48;
  
  id = (this->super_CliqueFinder).next_id;
  (this->super_CliqueFinder).next_id = id + 1;
  alignment = (alignment_autoptr->_M_t).
              super___uniq_ptr_impl<AlignmentRecord,_std::default_delete<AlignmentRecord>_>._M_t.
              super__Tuple_impl<0UL,_AlignmentRecord_*,_std::default_delete<AlignmentRecord>_>.
              super__Head_base<0UL,_AlignmentRecord_*,_false>._M_head_impl;
  (alignment_autoptr->_M_t).
  super___uniq_ptr_impl<AlignmentRecord,_std::default_delete<AlignmentRecord>_>._M_t.
  super__Tuple_impl<0UL,_AlignmentRecord_*,_std::default_delete<AlignmentRecord>_>.
  super__Head_base<0UL,_AlignmentRecord_*,_false>._M_head_impl = (AlignmentRecord *)0x0;
  local_78 = numGCAllowedPos;
  local_74 = ct;
  AlignmentRecord::setID(alignment,id);
  sVar1 = (this->super_CliqueFinder).alignment_count;
  (this->super_CliqueFinder).alignment_count = sVar1 + 1;
  local_58 = &this->alignments_;
  std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::push_back(local_58,&alignment)
  ;
  paVar6 = (adjacency_list_t *)operator_new(0x20);
  local_48._M_size = 0;
  paVar6->first = sVar1;
  local_48.super__List_node_base._M_next = &local_48.super__List_node_base;
  local_48.super__List_node_base._M_prev = &local_48.super__List_node_base;
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&paVar6->second,&local_48);
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
            ((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
  vertex = paVar6;
  std::
  vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
  ::push_back(this->vertices_as_lists_,&vertex);
  p_Var9 = (_List_node_base *)this->actives_;
  iVar8._M_node = p_Var9->_M_next;
  do {
    if (iVar8._M_node == p_Var9) {
      std::__cxx11::
      list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
      ::push_back((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                   *)p_Var9,&vertex);
      return;
    }
    p_Var9 = iVar8._M_node + 1;
    this_00 = (local_58->super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
              _M_impl.super__Vector_impl_data._M_start[(long)(iVar8._M_node[1]._M_next)->_M_next];
    local_68._M_node = iVar8._M_node;
    uVar3 = AlignmentRecord::getIntervalStart(alignment);
    uVar4 = AlignmentRecord::getIntervalEnd(this_00);
    if (uVar4 < uVar3) {
      ind = (((value_type)p_Var9->_M_next)->second).
            super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node._M_size;
      sVar7 = std::
              map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
              ::count(this->degree_map_,&ind);
      this_01 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                 *)this->degree_map_;
      if (sVar7 == 0) {
        std::__cxx11::
        list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
        ::list((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                *)&local_48,1,(value_type *)p_Var9,&local_79);
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
        ::
        _M_emplace_unique<unsigned_long&,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>
                  (this_01,&ind,
                   (list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                    *)&local_48);
        std::__cxx11::
        _List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
        ::_M_clear((_List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                    *)&local_48);
      }
      else {
        this_02 = std::
                  map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                  ::at((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                        *)this_01,&ind);
        std::__cxx11::
        list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
        ::push_back(this_02,(value_type *)p_Var9);
      }
      iVar8 = std::__cxx11::
              list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
              ::erase(this->actives_,local_68);
    }
    else {
      pEVar2 = (this->super_CliqueFinder).edge_calculator;
      iVar5 = (*pEVar2->_vptr_EdgeCalculator[2])
                        (pEVar2,alignment,this_00,(ulong)local_78,(ulong)local_74);
      if ((char)iVar5 != '\0') {
        pEVar2 = (this->super_CliqueFinder).second_edge_calculator;
        if ((pEVar2 != (EdgeCalculator *)0x0) &&
           (iVar5 = (*pEVar2->_vptr_EdgeCalculator[2])
                              (pEVar2,alignment,this_00,(ulong)local_78,(ulong)local_74),
           iVar8._M_node = local_68._M_node, (char)iVar5 == '\0')) goto LAB_00176855;
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&vertex->second,(value_type_conflict3 *)p_Var9->_M_next);
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&((value_type)p_Var9->_M_next)->second,&vertex->first);
        if (this->lw != (LogWriter *)0x0) {
          LogWriter::reportEdge
                    (this->lw,(uint)vertex->first,(uint)((value_type)p_Var9->_M_next)->first);
        }
        (this->super_CliqueFinder).converged = false;
      }
      iVar8._M_node = (local_68._M_node)->_M_next;
    }
LAB_00176855:
    p_Var9 = (_List_node_base *)this->actives_;
  } while( true );
}

Assistant:

void BronKerbosch::addAlignment(std::unique_ptr<AlignmentRecord>& alignment_autoptr, int& edgecounter, int &nonEdgeCounter, int numGCAllowedPos, int ct) {
	assert(alignment_autoptr.get() != nullptr);
	assert(cliques!=nullptr);
    assert(initialized);

	alignment_id_t id = next_id++;
	AlignmentRecord* alignment = alignment_autoptr.release();
	alignment->setID(id);

	size_t index = alignment_count++;
	alignments_.push_back(alignment);

    adjacency_list_t* vertex = new adjacency_list_t(index, list<size_t>());

    vertices_as_lists_->push_back(vertex);

    for (auto it = actives_->begin(); it != actives_->end();) {
        AlignmentRecord* alignment2 = alignments_[(*it)->first];

        if (alignment->getIntervalStart() > alignment2->getIntervalEnd()) {
            list<adjacency_list_t*>::size_type ind = (*it)->second.size();

            if(degree_map_->count(ind) == 0) {           
                degree_map_->emplace(ind, list<adjacency_list_t*>(1, *it) );
//		degree_map_->insert(std::pair<std::list<adjacency_list_t*>::size_type, std::list<adjacency_list_t*>> (ind, list<adjacency_list_t*>(1, *it)));
            } else {
                degree_map_->at(ind).push_back(*it);
            }
            
            it = actives_->erase(it);
            continue;
        }

        if(edge_calculator.edgeBetween(*alignment, *alignment2,numGCAllowedPos,ct) ) {

            if(second_edge_calculator != nullptr) {
                if(not second_edge_calculator->edgeBetween(*alignment, *alignment2,numGCAllowedPos,ct) ) {
                    continue;
                }
            }

            // Draw edge between current alignment and old alignment in vert
            get<1>(*vertex).push_back((*it)->first);
            get<1>(**it).push_back(vertex->first);

            if (lw != nullptr) lw->reportEdge(vertex->first, (*it)->first);

            converged = false;
        }
        it++;
    }

    actives_->push_back(vertex);

}